

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_or_i
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  size_t local_68;
  size_t indexes [2];
  uchar last_op [1];
  uchar middle_op [1];
  uchar top_op [1];
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  indexes[1]._7_1_ = 99;
  indexes[1]._6_1_ = 0x67;
  indexes[1]._5_1_ = 0x68;
  local_68 = 0;
  indexes[0] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,&local_68,(uchar *)((long)indexes + 0xf),1,
                     (uchar *)((long)indexes + 0xe),1,(uchar *)0x0,0,(uchar *)((long)indexes + 0xd),
                     1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_or_i(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char top_op[] = {OP_IF};
    unsigned char middle_op[] = {OP_ELSE};
    unsigned char last_op[] = {OP_ENDIF};
    const size_t indexes[] = {0, 1};
    /* IF [X] ELSE [Z] ENDIF */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        top_op,
        sizeof(top_op) / sizeof(unsigned char),
        middle_op,
        sizeof(middle_op) / sizeof(unsigned char),
        NULL,
        0,
        last_op,
        sizeof(last_op) / sizeof(unsigned char),
        script,
        script_len,
        write_len);
}